

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArduinoPressureSensor.h
# Opt level: O1

int GetLatestDataArduinoPressureSensor
              (ARDUINOPRESSURESENSOR *pArduinoPressureSensor,
              ARDUINOPRESSURESENSORDATA *pArduinoPressureSensorData)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ARDUINOPRESSURESENSORDATA *pAVar4;
  int iVar5;
  ulong uVar6;
  char *pcVar7;
  char *pcVar8;
  __time_t _Var9;
  long *plVar10;
  char cVar11;
  char *pcVar12;
  size_t __n;
  bool bVar13;
  CHRONO chrono;
  char recvbuf [512];
  char savebuf [256];
  int local_39c;
  timespec local_398;
  timespec local_388;
  undefined8 local_378;
  undefined8 uStack_370;
  long local_368;
  long lStack_360;
  timespec local_358;
  int local_348;
  ARDUINOPRESSURESENSORDATA *local_340;
  char local_338 [255];
  undefined1 auStack_239 [257];
  undefined1 local_138 [264];
  
  iVar5 = clock_getres(4,&local_358);
  if ((iVar5 == 0) && (iVar5 = clock_gettime(4,&local_388), iVar5 == 0)) {
    local_348 = 0;
    local_378 = 0;
    uStack_370 = 0;
    local_368 = 0;
    lStack_360 = 0;
  }
  uVar6 = 0;
  memset(local_338,0,0x200);
  memset(local_138,0,0x100);
  iVar5 = (pArduinoPressureSensor->RS232Port).DevType;
  cVar11 = '\x01';
  if (iVar5 - 1U < 4) {
    uVar6 = recv((pArduinoPressureSensor->RS232Port).s,local_338,0xff,0);
    if (-1 < (int)uVar6) {
      cVar11 = ((int)uVar6 == 0) * '\x02';
    }
  }
  else if (iVar5 == 0) {
    uVar6 = read(*(int *)&(pArduinoPressureSensor->RS232Port).hDev,local_338,0xff);
    cVar11 = '\x01';
    if (-1 < (int)uVar6) {
      cVar11 = ((int)uVar6 == 0) * '\x02';
    }
  }
  if (cVar11 == '\0') {
    local_39c = (int)uVar6;
    if ((pArduinoPressureSensor->bSaveRawData != 0) &&
       ((FILE *)pArduinoPressureSensor->pfSaveFile != (FILE *)0x0)) {
      fwrite(local_338,(long)local_39c,1,(FILE *)pArduinoPressureSensor->pfSaveFile);
      fflush((FILE *)pArduinoPressureSensor->pfSaveFile);
    }
    local_340 = pArduinoPressureSensorData;
    if (0xfe < local_39c) {
      if (local_39c == 0xff) {
        do {
          if (local_348 == 0) {
            clock_gettime(4,&local_398);
            local_398.tv_sec =
                 (local_398.tv_sec + local_368 + (local_398.tv_nsec + lStack_360) / 1000000000) -
                 local_388.tv_sec;
            local_398.tv_nsec = (local_398.tv_nsec + lStack_360) % 1000000000 - local_388.tv_nsec;
            if (local_398.tv_nsec < 0) {
              local_398.tv_sec = local_398.tv_sec + local_398.tv_nsec / 1000000000 + -1;
              local_398.tv_nsec = local_398.tv_nsec % 1000000000 + 1000000000;
            }
            plVar10 = &local_398.tv_nsec;
            _Var9 = local_398.tv_sec;
          }
          else {
            plVar10 = &lStack_360;
            _Var9 = local_368;
          }
          if (4.0 < (double)*plVar10 / 1000000000.0 + (double)_Var9) goto LAB_001bc1ce;
          memcpy(local_138,local_338,uVar6 & 0xffffffff);
          iVar5 = (pArduinoPressureSensor->RS232Port).DevType;
          cVar11 = '\x01';
          if (iVar5 - 1U < 4) {
            uVar6 = recv((pArduinoPressureSensor->RS232Port).s,local_338,0xff,0);
            if (-1 < (int)uVar6) {
              cVar11 = ((int)uVar6 == 0) * '\x02';
            }
          }
          else if (iVar5 == 0) {
            uVar6 = read(*(int *)&(pArduinoPressureSensor->RS232Port).hDev,local_338,0xff);
            cVar11 = ((int)uVar6 == 0) * '\x02';
            if ((int)uVar6 < 0) {
              cVar11 = '\x01';
            }
          }
          if (cVar11 != '\0') goto LAB_001bbb94;
          if ((pArduinoPressureSensor->bSaveRawData != 0) &&
             ((FILE *)pArduinoPressureSensor->pfSaveFile != (FILE *)0x0)) {
            fwrite(local_338,(long)(int)uVar6,1,(FILE *)pArduinoPressureSensor->pfSaveFile);
            fflush((FILE *)pArduinoPressureSensor->pfSaveFile);
          }
        } while ((int)uVar6 == 0xff);
      }
      __n = (size_t)(int)uVar6;
      memmove(auStack_239 + -__n,local_338,__n);
      local_39c = 0xff;
      memcpy(local_338,local_138 + __n,(long)(0xff - (int)uVar6));
    }
    pcVar12 = strstr(local_338,"Pressure: ");
    if (pcVar12 == (char *)0x0) {
      pcVar12 = (char *)0x0;
    }
    else {
      pcVar7 = strstr(pcVar12 + 10,"\r\n");
      if (pcVar7 == (char *)0x0) {
        pcVar12 = (char *)0x0;
      }
    }
    if (pcVar12 == (char *)0x0) {
      pcVar7 = (char *)0x0;
    }
    else {
      do {
        pcVar7 = pcVar12;
        pcVar12 = strstr(pcVar7 + 10,"Pressure: ");
        if (pcVar12 == (char *)0x0) {
          pcVar12 = (char *)0x0;
        }
        else {
          pcVar8 = strstr(pcVar12 + 10,"\r\n");
          if (pcVar8 == (char *)0x0) {
            pcVar12 = (char *)0x0;
          }
        }
      } while (pcVar12 != (char *)0x0);
    }
    pcVar12 = strstr(local_338,"Temperature: ");
    if (pcVar12 == (char *)0x0) {
      bVar13 = true;
    }
    else {
      pcVar12 = strstr(pcVar12 + 0xd,"\r\n");
      bVar13 = pcVar12 == (char *)0x0;
    }
    if ((pcVar7 == (char *)0x0) || (bVar13)) {
      do {
        if (local_348 == 0) {
          clock_gettime(4,&local_398);
          local_398.tv_sec =
               (local_398.tv_sec + local_368 + (local_398.tv_nsec + lStack_360) / 1000000000) -
               local_388.tv_sec;
          local_398.tv_nsec = (local_398.tv_nsec + lStack_360) % 1000000000 - local_388.tv_nsec;
          if (local_398.tv_nsec < 0) {
            local_398.tv_sec = local_398.tv_sec + local_398.tv_nsec / 1000000000 + -1;
            local_398.tv_nsec = local_398.tv_nsec % 1000000000 + 1000000000;
          }
          plVar10 = &local_398.tv_nsec;
          _Var9 = local_398.tv_sec;
        }
        else {
          plVar10 = &lStack_360;
          _Var9 = local_368;
        }
        if (4.0 < (double)*plVar10 / 1000000000.0 + (double)_Var9) {
LAB_001bc1ce:
          puts("Error reading data from an ArduinoPressureSensor : Message timeout. ");
          return 2;
        }
        if (0x1fe < local_39c) {
          puts("Error reading data from an ArduinoPressureSensor : Invalid data. ");
          return 4;
        }
        pcVar12 = local_338 + local_39c;
        iVar5 = (pArduinoPressureSensor->RS232Port).DevType;
        cVar11 = '\x01';
        if (iVar5 - 1U < 4) {
          uVar6 = recv((pArduinoPressureSensor->RS232Port).s,pcVar12,(long)(int)(0x1ffU - local_39c)
                       ,0);
          if (-1 < (int)uVar6) {
            cVar11 = ((int)uVar6 == 0) * '\x02';
          }
        }
        else if (iVar5 == 0) {
          uVar6 = read(*(int *)&(pArduinoPressureSensor->RS232Port).hDev,pcVar12,
                       (ulong)(0x1ffU - local_39c));
          cVar11 = ((int)uVar6 == 0) * '\x02';
          if ((int)uVar6 < 0) {
            cVar11 = '\x01';
          }
        }
        if (cVar11 != '\0') goto LAB_001bbb94;
        if ((pArduinoPressureSensor->bSaveRawData != 0) &&
           ((FILE *)pArduinoPressureSensor->pfSaveFile != (FILE *)0x0)) {
          fwrite(pcVar12,(long)(int)uVar6,1,(FILE *)pArduinoPressureSensor->pfSaveFile);
          fflush((FILE *)pArduinoPressureSensor->pfSaveFile);
        }
        pcVar12 = strstr(local_338,"Pressure: ");
        if (pcVar12 == (char *)0x0) {
          pcVar12 = (char *)0x0;
        }
        else {
          pcVar7 = strstr(pcVar12 + 10,"\r\n");
          if (pcVar7 == (char *)0x0) {
            pcVar12 = (char *)0x0;
          }
        }
        if (pcVar12 == (char *)0x0) {
          pcVar7 = (char *)0x0;
        }
        else {
          do {
            pcVar7 = pcVar12;
            pcVar12 = strstr(pcVar7 + 10,"Pressure: ");
            if (pcVar12 == (char *)0x0) {
              pcVar12 = (char *)0x0;
            }
            else {
              pcVar8 = strstr(pcVar12 + 10,"\r\n");
              if (pcVar8 == (char *)0x0) {
                pcVar12 = (char *)0x0;
              }
            }
          } while (pcVar12 != (char *)0x0);
        }
        pcVar12 = strstr(local_338,"Temperature: ");
        if (pcVar12 == (char *)0x0) {
          bVar13 = true;
        }
        else {
          pcVar12 = strstr(pcVar12 + 0xd,"\r\n");
          bVar13 = pcVar12 == (char *)0x0;
        }
        local_39c = local_39c + (int)uVar6;
      } while ((pcVar7 == (char *)0x0) || (bVar13));
    }
    pAVar4 = local_340;
    iVar5 = __isoc99_sscanf(pcVar7,"Pressure: %lf mbar",local_340);
    if (iVar5 == 1) {
      pAVar4->Pressure = pAVar4->pressure / 1000.0;
      iVar5 = __isoc99_sscanf(pcVar7,"Temperature: %lf deg C",&pAVar4->temperature);
      if (iVar5 == 1) {
        (pArduinoPressureSensor->LastArduinoPressureSensorData).Pressure = pAVar4->Pressure;
        dVar1 = pAVar4->pressure;
        dVar2 = pAVar4->temperature;
        dVar3 = pAVar4->altitude;
        (pArduinoPressureSensor->LastArduinoPressureSensorData).depth = pAVar4->depth;
        (pArduinoPressureSensor->LastArduinoPressureSensorData).altitude = dVar3;
        (pArduinoPressureSensor->LastArduinoPressureSensorData).pressure = dVar1;
        (pArduinoPressureSensor->LastArduinoPressureSensorData).temperature = dVar2;
        return 0;
      }
    }
    pcVar12 = "Error reading data from an ArduinoPressureSensor : Invalid data. ";
  }
  else {
LAB_001bbb94:
    pcVar12 = "Error reading data from an ArduinoPressureSensor. ";
  }
  puts(pcVar12);
  return 1;
}

Assistant:

inline int GetLatestDataArduinoPressureSensor(ARDUINOPRESSURESENSOR* pArduinoPressureSensor, ARDUINOPRESSURESENSORDATA* pArduinoPressureSensorData)
{
	char recvbuf[2*MAX_NB_BYTES_ARDUINOPRESSURESENSOR];
	char savebuf[MAX_NB_BYTES_ARDUINOPRESSURESENSOR];
	int BytesReceived = 0, Bytes = 0, recvbuflen = 0;
	char* ptr_P = NULL;
	char* ptr_T = NULL;
	CHRONO chrono;

	StartChrono(&chrono);

	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	memset(savebuf, 0, sizeof(savebuf));
	recvbuflen = MAX_NB_BYTES_ARDUINOPRESSURESENSOR-1; // The last character must be a 0 to be a valid string for sscanf.
	BytesReceived = 0;

	if (ReadRS232Port(&pArduinoPressureSensor->RS232Port, (unsigned char*)recvbuf, recvbuflen, &Bytes) != EXIT_SUCCESS)
	{
		printf("Error reading data from an ArduinoPressureSensor. \n");
		return EXIT_FAILURE;
	}
	if ((pArduinoPressureSensor->bSaveRawData)&&(pArduinoPressureSensor->pfSaveFile))
	{
		fwrite(recvbuf, Bytes, 1, pArduinoPressureSensor->pfSaveFile);
		fflush(pArduinoPressureSensor->pfSaveFile);
	}
	BytesReceived += Bytes;

	if (BytesReceived >= recvbuflen)
	{
		// If the buffer is full and if the device always sends data, there might be old data to discard...

		while (Bytes == recvbuflen)
		{
			if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_ARDUINOPRESSURESENSOR)
			{
				printf("Error reading data from an ArduinoPressureSensor : Message timeout. \n");
				return EXIT_TIMEOUT;
			}
			memcpy(savebuf, recvbuf, Bytes);
			if (ReadRS232Port(&pArduinoPressureSensor->RS232Port, (unsigned char*)recvbuf, recvbuflen, &Bytes) != EXIT_SUCCESS)
			{
				printf("Error reading data from an ArduinoPressureSensor. \n");
				return EXIT_FAILURE;
			}
			if ((pArduinoPressureSensor->bSaveRawData)&&(pArduinoPressureSensor->pfSaveFile)) 
			{
				fwrite(recvbuf, Bytes, 1, pArduinoPressureSensor->pfSaveFile);
				fflush(pArduinoPressureSensor->pfSaveFile);
			}
			BytesReceived += Bytes;
		}

		// The desired message should be among all the data gathered, unless there was 
		// so many other messages sent after that the desired message was in the 
		// discarded data, or we did not wait enough...

		memmove(recvbuf+recvbuflen-Bytes, recvbuf, Bytes);
		memcpy(recvbuf, savebuf+Bytes, recvbuflen-Bytes);

		// Only the last recvbuflen bytes received should be taken into account in what follows.
		BytesReceived = recvbuflen;
	}

	// The data need to be analyzed and we must check if we need to get more data from 
	// the device to get the desired message.
	// But normally we should not have to get more data unless we did not wait enough
	// for the desired message...

	ptr_P = FindLatestArduinoPressureSensorSentence("Pressure: ", recvbuf);
	ptr_T = FindLatestArduinoPressureSensorSentence("Temperature: ", recvbuf);

	while ((!ptr_P)||(!ptr_T))
	{
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_ARDUINOPRESSURESENSOR)
		{
			printf("Error reading data from an ArduinoPressureSensor : Message timeout. \n");
			return EXIT_TIMEOUT;
		}
		// The last character must be a 0 to be a valid string for sscanf.
		if (BytesReceived >= 2*MAX_NB_BYTES_ARDUINOPRESSURESENSOR-1)
		{
			printf("Error reading data from an ArduinoPressureSensor : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
		if (ReadRS232Port(&pArduinoPressureSensor->RS232Port, (unsigned char*)recvbuf+BytesReceived, 2*MAX_NB_BYTES_ARDUINOPRESSURESENSOR-1-BytesReceived, &Bytes) != EXIT_SUCCESS)
		{
			printf("Error reading data from an ArduinoPressureSensor. \n");
			return EXIT_FAILURE;
		}
		if ((pArduinoPressureSensor->bSaveRawData)&&(pArduinoPressureSensor->pfSaveFile)) 
		{
			fwrite((unsigned char*)recvbuf+BytesReceived, Bytes, 1, pArduinoPressureSensor->pfSaveFile);
			fflush(pArduinoPressureSensor->pfSaveFile);
		}
		BytesReceived += Bytes;
		ptr_P = FindLatestArduinoPressureSensorSentence("Pressure: ", recvbuf);
		ptr_T = FindLatestArduinoPressureSensorSentence("Temperature: ", recvbuf);
	}

	// Analyze data.

	//memset(pArduinoPressureSensorData, 0, sizeof(ARDUINOPRESSURESENSORDATA));

	if (ptr_P)
	{
		if (sscanf(ptr_P, "Pressure: %lf mbar", &pArduinoPressureSensorData->pressure) != 1)
		{
			printf("Error reading data from an ArduinoPressureSensor : Invalid data. \n");
			return EXIT_FAILURE;
		}
		// Conversions...
		pArduinoPressureSensorData->Pressure = pArduinoPressureSensorData->pressure/1000.0;
	}
	if (ptr_T)
	{
		if (sscanf(ptr_P, "Temperature: %lf deg C", &pArduinoPressureSensorData->temperature) != 1)
		{
			printf("Error reading data from an ArduinoPressureSensor : Invalid data. \n");
			return EXIT_FAILURE;
		}
	}

	pArduinoPressureSensor->LastArduinoPressureSensorData = *pArduinoPressureSensorData;

	return EXIT_SUCCESS;
}